

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCexMin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *p;
  Gia_Man_t *pAig_00;
  Abc_Cex_t *p_00;
  char *pcVar4;
  int iPoOld;
  Gia_Man_t *pGia;
  Aig_Man_t *pAig;
  int fVerbose;
  int nRounds;
  int nConfLimit;
  int c;
  Abc_Cex_t *vCexNew;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 1000;
  pAig._4_4_ = 1;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"CRvh");
      if (iVar2 == -1) {
        if (pAbc->pCex == (Abc_Cex_t *)0x0) {
          Abc_Print(1,"There is no current cex.\n");
          return 0;
        }
        pNtk_00 = Abc_FrameReadNtk(pAbc);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(1,"Main AIG: There is no current network.\n");
        }
        else {
          iVar2 = Abc_NtkIsStrash(pNtk_00);
          if (iVar2 == 0) {
            Abc_Print(1,"Main AIG: The current network is not an AIG.\n");
          }
          else {
            iVar2 = Abc_NtkPiNum(pNtk_00);
            if (iVar2 == pAbc->pCex->nPis) {
              p = Abc_NtkToDar(pNtk_00,0,1);
              pAig_00 = Gia_ManFromAigSimple(p);
              uVar3 = pAbc->pCex->iPo;
              iVar2 = Gia_ManFindFailedPoCex(pAig_00,pAbc->pCex,0);
              pAbc->pCex->iPo = iVar2;
              Gia_ManStop(pAig_00);
              if (pAbc->pCex->iPo == -1) {
                pAbc->pCex->iPo = uVar3;
                Abc_Print(-1,"Main AIG: The cex does not fail any outputs.\n");
                return 0;
              }
              if (uVar3 != pAbc->pCex->iPo) {
                Abc_Print(0,"Main AIG: The cex refined PO %d instead of PO %d.\n",
                          (ulong)(uint)pAbc->pCex->iPo,(ulong)uVar3);
              }
              p_00 = Saig_ManCexMinPerform(p,pAbc->pCex);
              Aig_ManStop(p);
              Abc_CexFree(p_00);
            }
            else {
              uVar3 = Abc_NtkPiNum(pNtk_00);
              Abc_Print(1,"Main AIG: The number of PIs (%d) is different from cex (%d).\n",
                        (ulong)uVar3,(ulong)(uint)pAbc->pCex->nPis);
            }
          }
        }
        return 0;
      }
      if (iVar2 == 0x43) break;
      if (iVar2 == 0x52) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
          goto LAB_002c9b69;
        }
        pAig._4_4_ = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if ((int)pAig._4_4_ < 0) goto LAB_002c9b69;
      }
      else {
        if (iVar2 == 0x68) goto LAB_002c9b69;
        if (iVar2 != 0x76) {
          Abc_Print(-2,"Unknown switch.\n");
          goto LAB_002c9b69;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < fVerbose);
LAB_002c9b69:
  Abc_Print(-2,"usage: cexmin [-CR num] [-vh]\n");
  Abc_Print(-2,"\t         reduces the length of the counter-example\n");
  Abc_Print(-2,"\t-C num : the maximum number of conflicts [default = %d]\n",(ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-R num : the number of minimization rounds [default = %d]\n",(ulong)pAig._4_4_);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandCexMin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Abc_Cex_t * vCexNew = NULL;
    int c;
    int nConfLimit = 1000;
    int nRounds    =    1;
    int fVerbose   =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CRvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRounds < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
        Abc_Print( 1, "Main AIG: There is no current network.\n");
    else if ( !Abc_NtkIsStrash(pNtk) )
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
    else if ( Abc_NtkPiNum(pNtk) != pAbc->pCex->nPis )
        Abc_Print( 1, "Main AIG: The number of PIs (%d) is different from cex (%d).\n", Abc_NtkPiNum(pNtk), pAbc->pCex->nPis );
//      else if ( Abc_NtkLatchNum(pNtk) != pAbc->pCex->nRegs )
//          Abc_Print( 1, "Main AIG: The number of registers (%d) is different from cex (%d).\n", Abc_NtkLatchNum(pNtk), pAbc->pCex->nRegs );
//      else if ( Abc_NtkPoNum(pNtk) <= pAbc->pCex->iPo )
//          Abc_Print( 1, "Main AIG: The number of POs (%d) is less than the PO index in cex (%d).\n", Abc_NtkPoNum(pNtk), pAbc->pCex->iPo );
    else
    {
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Gia_Man_t * pGia = Gia_ManFromAigSimple( pAig );
//        if ( !Gia_ManVerifyCex( pGia, pAbc->pCex, 0 ) )
        int iPoOld = pAbc->pCex->iPo;
        pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pGia, pAbc->pCex, 0 );
        Gia_ManStop( pGia );
        if ( pAbc->pCex->iPo == -1 )
        {
            pAbc->pCex->iPo = iPoOld;
            Abc_Print( -1, "Main AIG: The cex does not fail any outputs.\n" );
            return 0;
        }
        else if ( iPoOld != pAbc->pCex->iPo )
            Abc_Print( 0, "Main AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
        // perform minimization
        vCexNew = Saig_ManCexMinPerform( pAig, pAbc->pCex );
        Aig_ManStop( pAig );
        Abc_CexFree( vCexNew );
//        Abc_FrameReplaceCex( pAbc, &vCexNew );

//        Abc_Print( 1,"Implementation of this command is not finished.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: cexmin [-CR num] [-vh]\n" );
    Abc_Print( -2, "\t         reduces the length of the counter-example\n" );
    Abc_Print( -2, "\t-C num : the maximum number of conflicts [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-R num : the number of minimization rounds [default = %d]\n", nRounds );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}